

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ClearOutputData(ImFont *this)

{
  ImFont *this_local;
  
  this->FontSize = 0.0;
  this->FallbackAdvanceX = 0.0;
  ImVector<ImFontGlyph>::clear(&this->Glyphs);
  ImVector<float>::clear(&this->IndexAdvanceX);
  ImVector<unsigned_short>::clear(&this->IndexLookup);
  this->FallbackGlyph = (ImFontGlyph *)0x0;
  this->ContainerAtlas = (ImFontAtlas *)0x0;
  this->DirtyLookupTables = true;
  this->Descent = 0.0;
  this->Ascent = 0.0;
  this->MetricsTotalSurface = 0;
  return;
}

Assistant:

void    ImFont::ClearOutputData()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    Glyphs.clear();
    IndexAdvanceX.clear();
    IndexLookup.clear();
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    DirtyLookupTables = true;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
}